

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack8to4_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  uint _h;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  int *piVar13;
  undefined1 (*pauVar14) [16];
  int nn;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  undefined8 *puVar21;
  ulong uVar22;
  undefined8 *puVar23;
  int iVar24;
  ulong uVar25;
  undefined1 local_88 [64];
  size_t local_48;
  ulong local_38;
  
  uVar2 = bottom_im2col->w;
  uVar25 = (ulong)(int)uVar2;
  iVar3 = bottom_im2col->h;
  _h = bottom_im2col->c;
  local_38 = (ulong)(uint)top_blob->c;
  local_48 = 0;
  local_88._16_8_ = 0;
  local_88._24_4_ = 0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_88._32_8_ = (Allocator *)0x0;
  local_88._40_4_ = 0;
  local_88._44_4_ = 0;
  uVar20 = (uVar2 & 1) + (uVar2 >> 1);
  if ((long)uVar25 < 2) {
    uVar20 = uVar2;
  }
  Mat::create((Mat *)local_88,iVar3 << (1 < (long)uVar25),_h,uVar20,8,8,opt->workspace_allocator);
  if (0 < (int)uVar2 >> 1) {
    lVar15 = 0;
    uVar17 = 0;
    do {
      if (0 < (int)_h) {
        puVar21 = (undefined8 *)(local_48 * uVar17 * local_88._16_8_ + local_88._0_8_);
        uVar22 = 0;
        do {
          if (0 < iVar3) {
            puVar23 = (undefined8 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar22 + lVar15);
            iVar24 = iVar3;
            do {
              uVar12 = puVar23[1];
              *puVar21 = *puVar23;
              puVar21[1] = uVar12;
              puVar21 = puVar21 + 2;
              puVar23 = puVar23 + uVar2;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != _h);
      }
      uVar17 = uVar17 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar17 != (uint)((int)uVar2 >> 1));
  }
  uVar17 = uVar25 & 0xfffffffffffffffe;
  if ((uint)uVar17 != uVar2) {
    pvVar16 = (void *)(uVar17 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)_h) {
        uVar20 = ((uint)(uVar17 >> 0x1f) & 1) + (int)uVar17;
        puVar21 = (undefined8 *)
                  ((long)(int)(((int)uVar20 >> 1) + ((int)uVar17 - (uVar20 & 0xfffffffe))) *
                   local_48 * local_88._16_8_ + local_88._0_8_);
        uVar22 = 0;
        do {
          if (0 < iVar3) {
            puVar23 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar22 + (long)pvVar16);
            iVar24 = iVar3;
            do {
              *puVar21 = *puVar23;
              puVar21 = puVar21 + 1;
              puVar23 = puVar23 + uVar25;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != _h);
      }
      uVar17 = uVar17 + 1;
      pvVar16 = (void *)((long)pvVar16 + 8);
    } while ((long)uVar17 < (long)uVar25);
  }
  if (0 < (int)local_38) {
    uVar17 = 0;
    do {
      pauVar14 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar17 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar2 < 2) {
        uVar22 = 0;
      }
      else {
        lVar15 = 0;
        uVar18 = 0;
        do {
          if (0 < (int)(iVar3 * _h)) {
            pauVar14 = (undefined1 (*) [16])
                       (kernel->cstep * uVar17 * kernel->elemsize + (long)kernel->data);
            auVar1 = *(undefined1 (*) [16])(local_48 * local_88._16_8_ * lVar15 + local_88._0_8_);
            auVar4 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            vpunpcklbw_avx(auVar1,auVar4);
            vpunpckhbw_avx(auVar1,auVar4);
            auVar1 = *pauVar14;
            auVar4 = pauVar14[1];
            auVar5 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar4);
            vpunpcklbw_avx(auVar1,auVar5);
            vpunpckhbw_avx(auVar1,auVar5);
            vpunpcklbw_avx(auVar4,auVar6);
            vpunpckhbw_avx(auVar4,auVar6);
            halt_baddata();
          }
          auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar4 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar5 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar9 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar10 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar6 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar7 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar11 = vpunpcklqdq_avx(auVar1,auVar8);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar8);
          auVar1 = vpaddd_avx(auVar11,auVar1);
          auVar8 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar4 = vpunpckhqdq_avx(auVar4,auVar5);
          auVar4 = vpaddd_avx(auVar4,auVar8);
          auVar1 = vpaddd_avx(auVar1,auVar4);
          auVar5 = vpunpcklqdq_avx(auVar9,auVar10);
          auVar4 = vpunpckhqdq_avx(auVar9,auVar10);
          auVar4 = vpaddd_avx(auVar5,auVar4);
          auVar8 = vpunpcklqdq_avx(auVar6,auVar7);
          auVar5 = vpunpckhqdq_avx(auVar6,auVar7);
          auVar5 = vpaddd_avx(auVar5,auVar8);
          auVar4 = vpaddd_avx(auVar4,auVar5);
          *pauVar14 = auVar1;
          pauVar14[1] = auVar4;
          pauVar14 = pauVar14 + 2;
          uVar22 = uVar18 + 2;
          lVar19 = uVar18 + 3;
          lVar15 = lVar15 + 1;
          uVar18 = uVar22;
        } while (lVar19 < (long)uVar25);
      }
      if ((int)uVar22 < (int)uVar2) {
        do {
          if (0 < (int)(iVar3 * _h)) {
            pauVar14 = (undefined1 (*) [16])
                       (kernel->cstep * uVar17 * kernel->elemsize + (long)kernel->data);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)(local_48 * local_88._16_8_ *
                                      (ulong)(((uint)uVar22 & 1) +
                                             ((uint)(uVar22 >> 1) & 0x7fffffff)) + local_88._0_8_);
            vpmovsxbw_avx(auVar1);
            auVar1 = *pauVar14;
            auVar4 = pauVar14[1];
            auVar5 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar4);
            vpunpcklbw_avx(auVar1,auVar5);
            vpunpckhbw_avx(auVar1,auVar5);
            vpunpcklbw_avx(auVar4,auVar6);
            vpunpckhbw_avx(auVar4,auVar6);
            halt_baddata();
          }
          auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar6 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar4 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar5 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar7 = vpunpcklqdq_avx(auVar1,auVar6);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar6);
          auVar1 = vpaddd_avx(auVar7,auVar1);
          auVar6 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar4 = vpunpckhqdq_avx(auVar4,auVar5);
          auVar4 = vpaddd_avx(auVar4,auVar6);
          auVar1 = vpaddd_avx(auVar1,auVar4);
          *pauVar14 = auVar1;
          pauVar14 = pauVar14 + 1;
          uVar20 = (uint)uVar22 + 1;
          uVar22 = (ulong)uVar20;
        } while (uVar20 != uVar2);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_38);
  }
  piVar13 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}